

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyComputeWorstCase
              (Vec_Ptr_t *vTables,Vec_Flt_t **pvInd0,Vec_Flt_t **pvInd1,Vec_Flt_t **pvValues)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void **ppvVar8;
  int *piVar9;
  long lVar10;
  Vec_Flt_t *pVVar11;
  float *__dest;
  Vec_Flt_t *pVVar12;
  float *__dest_00;
  Vec_Flt_t *pVVar13;
  float *__dest_01;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  iVar2 = vTables->nSize;
  if (0 < (long)iVar2) {
    uVar7 = iVar2 / 3;
    if (iVar2 == uVar7 * 3) {
      ppvVar8 = vTables->pArray;
      pVVar12 = (Vec_Flt_t *)*ppvVar8;
      if (iVar2 - 3U < 3) {
        *pvInd0 = pVVar12;
        if ((1 < iVar2) && (*pvInd1 = (Vec_Flt_t *)vTables->pArray[1], iVar2 != 2)) {
          *pvValues = (Vec_Flt_t *)vTables->pArray[2];
          vTables->nSize = 0;
          return 1;
        }
      }
      else {
        pVVar11 = (Vec_Flt_t *)malloc(0x10);
        uVar3 = pVVar12->nSize;
        pVVar11->nSize = uVar3;
        iVar4 = pVVar12->nCap;
        pVVar11->nCap = iVar4;
        if ((long)iVar4 == 0) {
          __dest = (float *)0x0;
        }
        else {
          __dest = (float *)malloc((long)iVar4 << 2);
        }
        pVVar11->pArray = __dest;
        memcpy(__dest,pVVar12->pArray,(long)(int)uVar3 * 4);
        if (1 < iVar2) {
          piVar9 = (int *)ppvVar8[1];
          pVVar12 = (Vec_Flt_t *)malloc(0x10);
          uVar5 = piVar9[1];
          pVVar12->nSize = uVar5;
          iVar4 = *piVar9;
          pVVar12->nCap = iVar4;
          if ((long)iVar4 == 0) {
            __dest_00 = (float *)0x0;
          }
          else {
            __dest_00 = (float *)malloc((long)iVar4 << 2);
          }
          pVVar12->pArray = __dest_00;
          memcpy(__dest_00,*(void **)(piVar9 + 2),(long)(int)uVar5 * 4);
          if (iVar2 != 2) {
            piVar9 = (int *)ppvVar8[2];
            pVVar13 = (Vec_Flt_t *)malloc(0x10);
            uVar6 = piVar9[1];
            pVVar13->nSize = uVar6;
            iVar4 = *piVar9;
            pVVar13->nCap = iVar4;
            if ((long)iVar4 == 0) {
              __dest_01 = (float *)0x0;
            }
            else {
              __dest_01 = (float *)malloc((long)iVar4 << 2);
            }
            pVVar13->pArray = __dest_01;
            memcpy(__dest_01,*(void **)(piVar9 + 2),(long)(int)uVar6 * 4);
            if (5 < iVar2) {
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              uVar14 = 2;
              if (2 < (int)uVar7) {
                uVar14 = (ulong)uVar7;
              }
              uVar15 = 1;
              do {
                if ((((ulong)(long)iVar2 <= uVar15 * 3) ||
                    (iVar4 = (int)(uVar15 * 3), iVar2 <= iVar4 + 1)) || (iVar2 <= iVar4 + 2))
                goto LAB_00460dca;
                uVar7 = *(uint *)((long)ppvVar8[uVar15 * 3] + 4);
                if (uVar7 == uVar3) {
                  if (0 < (int)uVar7) {
                    uVar17 = 0;
                    do {
                      fVar1 = *(float *)(*(long *)((long)ppvVar8[uVar15 * 3] + 8) + uVar17 * 4);
                      if ((fVar1 != __dest[uVar17]) || (NAN(fVar1) || NAN(__dest[uVar17])))
                      goto LAB_00460d83;
                      uVar17 = uVar17 + 1;
                    } while (uVar7 != uVar17);
                  }
                  uVar7 = *(uint *)((long)ppvVar8[uVar15 * 3 + 1] + 4);
                  if (uVar7 == uVar5) {
                    if (0 < (int)uVar7) {
                      uVar17 = 0;
                      do {
                        fVar1 = *(float *)(*(long *)((long)ppvVar8[uVar15 * 3 + 1] + 8) + uVar17 * 4
                                          );
                        if ((fVar1 != __dest_00[uVar17]) || (NAN(fVar1) || NAN(__dest_00[uVar17])))
                        goto LAB_00460d83;
                        uVar17 = uVar17 + 1;
                      } while (uVar7 != uVar17);
                    }
                    uVar17 = (ulong)*(int *)((long)ppvVar8[uVar15 * 3 + 2] + 4);
                    if (0 < (long)uVar17) {
                      lVar10 = *(long *)((long)ppvVar8[uVar15 * 3 + 2] + 8);
                      uVar16 = 0;
                      do {
                        if (uVar6 == uVar16) {
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
                        }
                        fVar1 = *(float *)(lVar10 + uVar16 * 4);
                        if (__dest_01[uVar16] <= fVar1 && fVar1 != __dest_01[uVar16]) {
                          __dest_01[uVar16] = fVar1;
                        }
                        uVar16 = uVar16 + 1;
                      } while (uVar17 != uVar16);
                    }
                  }
                }
LAB_00460d83:
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar14);
            }
            *pvInd0 = pVVar11;
            *pvInd1 = pVVar12;
            *pvValues = pVVar13;
            return 1;
          }
        }
      }
LAB_00460dca:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  __assert_fail("Vec_PtrSize(vTables) > 0 && Vec_PtrSize(vTables) % 3 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x495,
                "int Scl_LibertyComputeWorstCase(Vec_Ptr_t *, Vec_Flt_t **, Vec_Flt_t **, Vec_Flt_t **)"
               );
}

Assistant:

int Scl_LibertyComputeWorstCase( Vec_Ptr_t * vTables, Vec_Flt_t ** pvInd0, Vec_Flt_t ** pvInd1, Vec_Flt_t ** pvValues )
{
    Vec_Flt_t * vInd0, * vInd1, * vValues;
    Vec_Flt_t * vind0, * vind1, * vvalues;
    int i, k, nTriples = Vec_PtrSize(vTables) / 3;
    float Entry;
    assert( Vec_PtrSize(vTables) > 0 && Vec_PtrSize(vTables) % 3 == 0 );
    if ( nTriples == 1 )
    {
        *pvInd0   = (Vec_Flt_t *)Vec_PtrEntry(vTables, 0);
        *pvInd1   = (Vec_Flt_t *)Vec_PtrEntry(vTables, 1);
        *pvValues = (Vec_Flt_t *)Vec_PtrEntry(vTables, 2);
        Vec_PtrShrink( vTables, 0 );
        return 1;
    }
    vInd0   = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 0) );
    vInd1   = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 1) );
    vValues = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 2) );
    for ( i = 1; i < nTriples; i++ )
    {
        vind0   = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+0);
        vind1   = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+1);
        vvalues = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+2);
        // check equality of indexes
        if ( !Vec_FltEqual(vind0, vInd0) )
            continue;//return 0;
        if ( !Vec_FltEqual(vind1, vInd1) )
            continue;//return 0;
//        Vec_FltForEachEntry( vvalues, Entry, k )
//            Vec_FltAddToEntry( vValues, k, Entry );
        Vec_FltForEachEntry( vvalues, Entry, k )
            if ( Vec_FltEntry(vValues, k) < Entry )
                Vec_FltWriteEntry( vValues, k, Entry );
    }
//    Vec_FltForEachEntry( vValues, Entry, k )
//        Vec_FltWriteEntry( vValues, k, Entry/nTriples );
    // return the result
    *pvInd0 = vInd0;
    *pvInd1 = vInd1;
    *pvValues = vValues;
    return 1;
}